

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O2

error<idx2::err_code> idx2::WriteBuffer(cstr FileName,buffer *Buf)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *pcVar5;
  long *in_FS_OFFSET;
  stref sVar6;
  error<idx2::err_code> eVar7;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:48:3)>
  __ScopeGuard__48;
  FILE *Fp;
  
  Fp = (FILE *)fopen(FileName,"wb");
  __ScopeGuard__48.Func.Fp = &Fp;
  __ScopeGuard__48.Dismissed = false;
  if ((FILE *)Fp == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x32;
    sVar6 = ToString(FileCreateFailed);
    lVar1 = *in_FS_OFFSET;
    iVar2 = snprintf((char *)(lVar1 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)sVar6.Size,sVar6.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                     ,0x32);
    pcVar5 = "%s";
    snprintf((char *)(lVar1 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
    uVar4 = 0x1000000000a;
  }
  else {
    sVar3 = fwrite(Buf->Data,Buf->Bytes,1,(FILE *)Fp);
    lVar1 = *in_FS_OFFSET;
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    if (sVar3 == 1) {
      *(undefined4 *)(lVar1 + -0x200) = 0x37;
      pcVar5 = "";
      uVar4 = 0;
    }
    else {
      *(undefined4 *)(lVar1 + -0x200) = 0x36;
      sVar6 = ToString(FileWriteFailed);
      lVar1 = *in_FS_OFFSET;
      iVar2 = snprintf((char *)(lVar1 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar6.Size,sVar6.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                       ,0x36);
      pcVar5 = "%s";
      snprintf((char *)(lVar1 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
      uVar4 = 0x1000000000c;
    }
  }
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:48:3)>
  ::~scope_guard(&__ScopeGuard__48);
  eVar7.Code = (int)uVar4;
  eVar7.StackIdx = (char)((ulong)uVar4 >> 0x20);
  eVar7.StrGened = (bool)(char)((ulong)uVar4 >> 0x28);
  eVar7._14_2_ = (short)((ulong)uVar4 >> 0x30);
  eVar7.Msg = pcVar5;
  return eVar7;
}

Assistant:

error<>
WriteBuffer(cstr FileName, const buffer& Buf)
{
  idx2_Assert(Buf.Data && Buf.Bytes);

  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileCreateFailed, "%s", FileName);

  /* Read file contents */
  if (fwrite(Buf.Data, size_t(Buf.Bytes), 1, Fp) != 1)
    return idx2_Error(err_code::FileWriteFailed, "%s", FileName);
  return idx2_Error(err_code::NoError);
}